

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O2

RunResult wabt::interp::IntDiv<int>(int lhs,int rhs,int *out,string *out_msg)

{
  RunResult RVar1;
  
  if ((rhs == 0) || (rhs == -1 && lhs == -0x80000000)) {
    std::__cxx11::string::assign((char *)out_msg);
    RVar1 = Trap;
  }
  else {
    *out = lhs / rhs;
    RVar1 = Ok;
  }
  return RVar1;
}

Assistant:

RunResult WABT_VECTORCALL IntDiv(T lhs, T rhs, T* out, std::string* out_msg) {
  if (WABT_UNLIKELY(rhs == 0)) {
    *out_msg = "integer divide by zero";
    return RunResult::Trap;
  }
  if (WABT_LIKELY(IsNormalDivRem(lhs, rhs))) {
    *out = lhs / rhs;
    return RunResult::Ok;
  } else {
    *out_msg = "integer overflow";
    return RunResult::Trap;
  }
}